

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

GLenum gl4cts::EnhancedLayouts::Utils::Buffer::GetAccessGLenum(ACCESS access)

{
  TestError *this;
  GLenum local_10;
  GLenum result;
  ACCESS access_local;
  
  if (access == ReadOnly) {
    local_10 = 35000;
  }
  else if (access == WriteOnly) {
    local_10 = 0x88b9;
  }
  else {
    if (access != ReadWrite) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                 ,0x784);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    local_10 = 0x88ba;
  }
  return local_10;
}

Assistant:

GLenum Buffer::GetAccessGLenum(ACCESS access)
{
	GLenum result = 0;

	switch (access)
	{
	case ReadOnly:
		result = GL_READ_ONLY;
		break;
	case WriteOnly:
		result = GL_WRITE_ONLY;
		break;
	case ReadWrite:
		result = GL_READ_WRITE;
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	return result;
}